

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O0

int8 * rw::ps2::getADCbits(Geometry *geo)

{
  int *piVar1;
  ADCData *adc;
  int8 *bits;
  Geometry *geo_local;
  
  adc = (ADCData *)0x0;
  if ((adcOffset != 0) &&
     (piVar1 = (int *)((long)geo->texCoords + (long)adcOffset + -0x38), *piVar1 != 0)) {
    adc = *(ADCData **)(piVar1 + 2);
  }
  return (int8 *)adc;
}

Assistant:

int8*
getADCbits(Geometry *geo)
{
	int8 *bits = nil;
	if(adcOffset){
		ADCData *adc = PLUGINOFFSET(ADCData, geo, adcOffset);
		if(adc->adcFormatted)
			bits = adc->adcBits;
	}
	return bits;
}